

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

string * __thiscall
booster::locale::impl_icu::raii_casemap::
convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
          (string *__return_storage_ptr__,raii_casemap *this,
          _func_int_UCaseMap_ptr_char_ptr_int_char_ptr_int_UErrorCode_ptr *func,char *begin,
          char *end)

{
  UErrorCode UVar1;
  int iVar2;
  runtime_error *this_00;
  char *pcVar3;
  int iVar4;
  UErrorCode err;
  vector<char,_std::allocator<char>_> buf;
  UErrorCode local_70;
  allocator local_69;
  vector<char,_std::allocator<char>_> local_68;
  string local_50;
  
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,(((long)end - (long)begin) * 0xb) / 10 + 1,(allocator_type *)&local_50);
  local_70 = U_ZERO_ERROR;
  iVar4 = (int)((long)end - (long)begin);
  iVar2 = (*func)(this->map_,
                  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (int)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                  (int)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,begin,iVar4,&local_70);
  if (local_70 == U_BUFFER_OVERFLOW_ERROR) {
    local_70 = U_ZERO_ERROR;
    std::vector<char,_std::allocator<char>_>::resize(&local_68,(long)(iVar2 + 1));
    iVar2 = (*func)(this->map_,
                    local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (int)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                    (int)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,begin,iVar4,&local_70);
  }
  UVar1 = local_70;
  if (local_70 < U_ILLEGAL_ARGUMENT_ERROR) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + iVar2);
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  pcVar3 = (char *)u_errorName_70(UVar1);
  std::__cxx11::string::string((string *)&local_50,pcVar3,&local_69);
  runtime_error::runtime_error(this_00,&local_50);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

std::string convert(Conv func,char const *begin,char const *end) const
        {
                std::vector<char> buf((end-begin)*11/10+1);
                UErrorCode err=U_ZERO_ERROR;
                int size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                if(err == U_BUFFER_OVERFLOW_ERROR) {
                    err = U_ZERO_ERROR;
                    buf.resize(size+1);
                    size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                }
                check_and_throw_icu_error(err);
                return std::string(&buf.front(),size);
        }